

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void doctest::anon_unknown_14::FatalConditionHandler::handleSignal(int sig)

{
  int *piVar1;
  pointer ppIVar2;
  IReporter *pIVar3;
  pointer pSVar4;
  long *__src;
  long lVar5;
  size_t sVar6;
  IReporter **curr_rep;
  pointer ppIVar7;
  ContextState *this;
  char *pcVar8;
  allocator<char> local_75;
  int local_74;
  long *local_70 [2];
  long local_60 [2];
  anon_union_24_2_13149d16_for_String_2 local_50;
  undefined1 local_38;
  
  lVar5 = 8;
  pcVar8 = "<unknown signal>";
  do {
    if (*(int *)((long)&PTR_typeinfo_name_00140778 + lVar5) == sig) {
      pcVar8 = *(char **)((long)&(anonymous_namespace)::signalDefs + lVar5);
      break;
    }
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x68);
  local_74 = sig;
  reset();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_70,pcVar8,&local_75);
  this = detail::g_cs;
  piVar1 = &(detail::g_cs->super_CurrentTestCaseStats).failure_flags;
  *piVar1 = *piVar1 | 4;
  ppIVar7 = (this->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppIVar2 = (this->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppIVar7 != ppIVar2) {
    do {
      __src = local_70[0];
      pIVar3 = *ppIVar7;
      sVar6 = strlen((char *)local_70[0]);
      pcVar8 = String::allocate((String *)&local_50.data,(uint)sVar6);
      memcpy(pcVar8,__src,sVar6 & 0xffffffff);
      local_38 = 1;
      (*pIVar3->_vptr_IReporter[6])(pIVar3,&local_50);
      if ((local_50.buf[0x17] < '\0') && (local_50.data.ptr != (char *)0x0)) {
        operator_delete__(local_50.data.ptr);
      }
      ppIVar7 = ppIVar7 + 1;
      this = detail::g_cs;
    } while (ppIVar7 != ppIVar2);
  }
  while (pSVar4 = (this->subcasesStack).
                  super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
        pSVar4 != (this->subcasesStack).
                  super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
    (this->subcasesStack).
    super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>.
    _M_impl.super__Vector_impl_data._M_finish = pSVar4 + -1;
    if ((pSVar4[-1].m_name.field_0.buf[0x17] < '\0') &&
       (pcVar8 = pSVar4[-1].m_name.field_0.data.ptr, pcVar8 != (char *)0x0)) {
      operator_delete__(pcVar8);
      this = detail::g_cs;
    }
    ppIVar2 = (this->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppIVar7 = (this->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    for (; ppIVar7 != ppIVar2; ppIVar7 = ppIVar7 + 1) {
      (*(*ppIVar7)->_vptr_IReporter[8])();
      this = detail::g_cs;
    }
  }
  detail::ContextState::finalizeTestCaseData(this);
  ppIVar7 = (detail::g_cs->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppIVar2 = (detail::g_cs->reporters_currently_used).
            super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppIVar7 != ppIVar2) {
    do {
      (*(*ppIVar7)->_vptr_IReporter[5])(*ppIVar7,&detail::g_cs->super_CurrentTestCaseStats);
      ppIVar7 = ppIVar7 + 1;
    } while (ppIVar7 != ppIVar2);
    ppIVar2 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar7 = (detail::g_cs->reporters_currently_used).
                   super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppIVar7 != ppIVar2;
        ppIVar7 = ppIVar7 + 1) {
      (*(*ppIVar7)->_vptr_IReporter[2])(*ppIVar7,&detail::g_cs->super_TestRunStats);
    }
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  raise(local_74);
  return;
}

Assistant:

static void handleSignal(int sig) {
            const char* name = "<unknown signal>";
            for(std::size_t i = 0; i < DOCTEST_COUNTOF(signalDefs); ++i) {
                SignalDefs& def = signalDefs[i];
                if(sig == def.id) {
                    name = def.name;
                    break;
                }
            }
            reset();
            reportFatal(name);
            raise(sig);
        }